

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_socket_manager.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::utp_socket_manager::remove_udp_socket
          (utp_socket_manager *this,weak_ptr<libtorrent::aux::utp_socket_interface> *sock)

{
  bool bVar1;
  pointer this_00;
  shared_ptr<libtorrent::aux::utp_socket_interface> local_58;
  reference local_48;
  pair<const_unsigned_short,_std::unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>_>
  *s;
  iterator __end2;
  iterator __begin2;
  socket_map_t *__range2;
  shared_ptr<libtorrent::aux::utp_socket_interface> iface;
  weak_ptr<libtorrent::aux::utp_socket_interface> *sock_local;
  utp_socket_manager *this_local;
  
  iface.super___shared_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sock;
  ::std::weak_ptr<libtorrent::aux::utp_socket_interface>::lock
            ((weak_ptr<libtorrent::aux::utp_socket_interface> *)&__range2);
  __end2 = ::std::
           multimap<unsigned_short,_std::unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>_>_>_>
           ::begin(&this->m_utp_sockets);
  s = (pair<const_unsigned_short,_std::unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>_>
       *)::std::
         multimap<unsigned_short,_std::unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>_>_>_>
         ::end(&this->m_utp_sockets);
  while (bVar1 = ::std::operator!=(&__end2,(_Self *)&s), bVar1) {
    local_48 = ::std::
               _Rb_tree_iterator<std::pair<const_unsigned_short,_std::unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>_>_>
               ::operator*(&__end2);
    ::std::
    unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
    ::operator->(&local_48->second);
    ::std::weak_ptr<libtorrent::aux::utp_socket_interface>::lock
              ((weak_ptr<libtorrent::aux::utp_socket_interface> *)&local_58);
    bVar1 = ::std::operator!=(&local_58,
                              (shared_ptr<libtorrent::aux::utp_socket_interface> *)&__range2);
    ::std::shared_ptr<libtorrent::aux::utp_socket_interface>::~shared_ptr(&local_58);
    if (!bVar1) {
      this_00 = ::std::
                unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
                ::operator->(&local_48->second);
      utp_socket_impl::abort(this_00);
    }
    ::std::
    _Rb_tree_iterator<std::pair<const_unsigned_short,_std::unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>_>_>
    ::operator++(&__end2);
  }
  ::std::shared_ptr<libtorrent::aux::utp_socket_interface>::~shared_ptr
            ((shared_ptr<libtorrent::aux::utp_socket_interface> *)&__range2);
  return;
}

Assistant:

void utp_socket_manager::remove_udp_socket(std::weak_ptr<utp_socket_interface> sock)
	{
		auto iface = sock.lock();
		for (auto& s : m_utp_sockets)
		{
			if (s.second->m_sock.lock() != iface)
				continue;

			s.second->abort();
		}
	}